

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

Aig_Man_t * Fra_FramesWithClasses(Fra_Man_t *p)

{
  Aig_Man_t *pAVar1;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Man_t *pAVar6;
  long lVar7;
  ulong uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x87,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  pAVar1 = p->pManAig;
  if (pAVar1->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pManAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x88,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  if (pAVar1->nObjs[2] <= pAVar1->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x89,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  pAVar1 = Aig_ManStart(p->nFramesAll * pAVar1->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pManAig->pName);
  pAVar1->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pManAig->pSpec);
  pAVar1->pSpec = pcVar2;
  pAVar1->nRegs = p->pManAig->nRegs;
  iVar9 = p->nFramesAll;
  lVar7 = 0;
  iVar10 = 0;
  if (0 < iVar9) {
    iVar10 = iVar9;
  }
  for (; iVar10 != (int)lVar7; lVar7 = lVar7 + 1) {
    pAVar4 = p->pManAig->pConst1;
    pvVar3 = (pAVar4->field_5).pData;
    *(Aig_Obj_t **)
     (*(long *)((long)pvVar3 + 0x20) +
     ((long)pAVar4->Id * (long)*(int *)((long)pvVar3 + 0x18) + lVar7) * 8) = pAVar1->pConst1;
  }
  for (iVar10 = 0; iVar10 < iVar9; iVar10 = iVar10 + 1) {
    for (iVar9 = 0; pAVar6 = p->pManAig, iVar9 < pAVar6->nObjs[2] - pAVar6->nRegs; iVar9 = iVar9 + 1
        ) {
      pvVar3 = Vec_PtrEntry(pAVar6->vCis,iVar9);
      pAVar4 = Aig_ObjCreateCi(pAVar1);
      *(Aig_Obj_t **)
       (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) +
       (long)(*(int *)((long)pvVar3 + 0x24) * *(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) +
             iVar10) * 8) = pAVar4;
    }
    iVar9 = p->nFramesAll;
  }
  pAVar6 = p->pManAig;
  for (iVar9 = pAVar6->nObjs[2] - pAVar6->nRegs; iVar9 < pAVar6->vCis->nSize; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar6->vCis,iVar9);
    pAVar4 = Aig_ObjCreateCi(pAVar1);
    *(Aig_Obj_t **)
     (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) +
     (long)*(int *)((long)pvVar3 + 0x24) * (long)*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) * 8
     ) = pAVar4;
    pAVar6 = p->pManAig;
  }
  iVar9 = 0;
  while (iVar10 = iVar9, iVar10 < p->nFramesAll + -1) {
    for (iVar9 = pAVar6->nObjs[2] - pAVar6->nRegs; iVar9 < pAVar6->vCis->nSize; iVar9 = iVar9 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,iVar9);
      Fra_FramesConstrainNode(pAVar1,pAVar4,iVar10);
      pAVar6 = p->pManAig;
    }
    for (iVar9 = 0; iVar9 < pAVar6->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vObjs,iVar9);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Fra_ObjChild0Fra(pAVar4,iVar10);
        if (((ulong)pAVar4 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fra.h"
                        ,0x111,"Aig_Obj_t *Fra_ObjChild1Fra(Aig_Obj_t *, int)");
        }
        uVar8 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar4->pFanin1 & 1) ^
               *(ulong *)(*(long *)(*(long *)(uVar8 + 0x28) + 0x20) +
                         (long)(*(int *)(uVar8 + 0x24) * *(int *)(*(long *)(uVar8 + 0x28) + 0x18) +
                               iVar10) * 8));
        }
        pAVar5 = Aig_And(pAVar1,pAVar5,p1);
        *(Aig_Obj_t **)
         (*(long *)((long)(pAVar4->field_5).pData + 0x20) +
         (long)(pAVar4->Id * *(int *)((long)(pAVar4->field_5).pData + 0x18) + iVar10) * 8) = pAVar5;
        Fra_FramesConstrainNode(pAVar1,pAVar4,iVar10);
      }
      pAVar6 = p->pManAig;
    }
    for (iVar11 = 0; iVar9 = iVar10 + 1, iVar11 < pAVar6->nRegs; iVar11 = iVar11 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCos,(pAVar6->nObjs[3] - pAVar6->nRegs) + iVar11);
      pAVar6 = p->pManAig;
      pvVar3 = Vec_PtrEntry(pAVar6->vCis,(pAVar6->nObjs[2] - pAVar6->nRegs) + iVar11);
      pAVar4 = Fra_ObjChild0Fra(pAVar4,iVar10);
      *(Aig_Obj_t **)
       (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) +
       (long)(*(int *)((long)pvVar3 + 0x24) * *(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) +
             iVar10 + 1) * 8) = pAVar4;
      pAVar6 = p->pManAig;
    }
  }
  pAVar1->nAsserts = pAVar1->nObjs[3];
  for (iVar9 = pAVar6->nObjs[2] - pAVar6->nRegs; iVar9 < pAVar6->vCis->nSize; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar6->vCis,iVar9);
    Aig_ObjCreateCo(pAVar1,*(Aig_Obj_t **)
                            (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) + -8 +
                            ((long)*(int *)((long)pvVar3 + 0x24) *
                             (long)*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) +
                            (long)p->nFramesAll) * 8));
    pAVar6 = p->pManAig;
  }
  Aig_ManCleanup(pAVar1);
  if (pAVar1->pData != (void *)0x0) {
    __assert_fail("pManFraig->pData == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0xb6,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  return pAVar1;
}

Assistant:

Aig_Man_t * Fra_FramesWithClasses( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, k, f;
    assert( p->pManFraig == NULL );
    assert( Aig_ManRegNum(p->pManAig) > 0 );
    assert( Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig) );

    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) * p->nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs = p->pManAig->nRegs;
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), f, Aig_ManConst1(pManFraig) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pManAig, pObj, i )
            Fra_ObjSetFraig( pObj, f, Aig_ObjCreateCi(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );

    // add timeframes
//    pManFraig->fAddStrash = 1;
    for ( f = 0; f < p->nFramesAll - 1; f++ )
    {
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pManAig, pObj, i )
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pManAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Fra(pObj,f), Fra_ObjChild1Fra(pObj,f) );
            Fra_ObjSetFraig( pObj, f, pObjNew );
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        }
        // transfer latch input to the latch outputs 
        Aig_ManForEachLiLoSeq( p->pManAig, pObjLi, pObjLo, k )
            Fra_ObjSetFraig( pObjLo, f+1, Fra_ObjChild0Fra(pObjLi,f) );
    }
//    pManFraig->fAddStrash = 0;
    // mark the asserts
    pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
    // add the POs for the latch outputs of the last frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Aig_ObjCreateCo( pManFraig, Fra_ObjFraig(pObj,p->nFramesAll-1) );

    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}